

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.h
# Opt level: O2

void __thiscall phyr::OrenNayar::OrenNayar(OrenNayar *this,Spectrum *R,double sigma)

{
  double dVar1;
  
  (this->super_BxDF).type = BSDF_DIFFUSE|BSDF_REFLECTION;
  (this->super_BxDF)._vptr_BxDF = (_func_int **)&PTR__BxDF_001987a8;
  memcpy(&this->R,R,0x1e0);
  dVar1 = sigma * 0.017453292519943295 * sigma * 0.017453292519943295;
  this->A = 1.0 - dVar1 / (dVar1 + 0.33000001311302185 + dVar1 + 0.33000001311302185);
  this->B = (dVar1 * 0.44999998807907104) / (dVar1 + 0.09000000357627869);
  return;
}

Assistant:

OrenNayar(const Spectrum& R, Real sigma)
        : BxDF(BxDFType(BSDF_REFLECTION | BSDF_DIFFUSE)), R(R) {
        sigma = radians(sigma);
        Real sigma2 = sigma * sigma;
        A = 1.f - (sigma2 / (2.f * (sigma2 + 0.33f)));
        B = 0.45f * sigma2 / (sigma2 + 0.09f);
    }